

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes_main.cc
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  string output_path;
  string input_path;
  Webm2Pes converter;
  string local_f0;
  string local_d0;
  Webm2Pes local_b0;
  
  if (argc < 3) {
    printf("Usage: %s <WebM file> <output file>",*argv);
    uVar2 = 1;
  }
  else {
    std::__cxx11::string::string((string *)&local_d0,argv[1],(allocator *)&local_b0);
    std::__cxx11::string::string((string *)&local_f0,argv[2],(allocator *)&local_b0);
    libwebm::Webm2Pes::Webm2Pes(&local_b0,&local_d0,&local_f0);
    bVar1 = libwebm::Webm2Pes::ConvertToFile(&local_b0);
    libwebm::Webm2Pes::~Webm2Pes(&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    uVar2 = (uint)!bVar1;
  }
  return uVar2;
}

Assistant:

int main(int argc, const char* argv[]) {
  if (argc < 3) {
    Usage(argv);
    return EXIT_FAILURE;
  }

  const std::string input_path = argv[1];
  const std::string output_path = argv[2];

  libwebm::Webm2Pes converter(input_path, output_path);
  return converter.ConvertToFile() == true ? EXIT_SUCCESS : EXIT_FAILURE;
}